

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_interface.cpp
# Opt level: O2

XrGeneratedDispatchTableCore * RuntimeInterface::GetDispatchTable(XrInstance instance)

{
  unique_ptr<RuntimeInterface,_std::default_delete<RuntimeInterface>_> *puVar1;
  iterator iVar2;
  mutex *__mutex;
  XrGeneratedDispatchTableCore *pXVar3;
  key_type local_18;
  
  puVar1 = GetInstance();
  __mutex = &((puVar1->_M_t).
              super___uniq_ptr_impl<RuntimeInterface,_std::default_delete<RuntimeInterface>_>._M_t.
              super__Tuple_impl<0UL,_RuntimeInterface_*,_std::default_delete<RuntimeInterface>_>.
              super__Head_base<0UL,_RuntimeInterface_*,_false>._M_head_impl)->_dispatch_table_mutex;
  std::mutex::lock(__mutex);
  puVar1 = GetInstance();
  iVar2 = std::
          _Hashtable<XrInstance_T_*,_std::pair<XrInstance_T_*const,_std::unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>_>,_std::allocator<std::pair<XrInstance_T_*const,_std::unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>_>_>,_std::__detail::_Select1st,_std::equal_to<XrInstance_T_*>,_std::hash<XrInstance_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(((puVar1->_M_t).
                    super___uniq_ptr_impl<RuntimeInterface,_std::default_delete<RuntimeInterface>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_RuntimeInterface_*,_std::default_delete<RuntimeInterface>_>
                    .super__Head_base<0UL,_RuntimeInterface_*,_false>._M_head_impl)->
                  _dispatch_table_map)._M_h,&local_18);
  GetInstance();
  if (iVar2.
      super__Node_iterator_base<std::pair<XrInstance_T_*const,_std::unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    pXVar3 = (XrGeneratedDispatchTableCore *)0x0;
  }
  else {
    pXVar3 = *(XrGeneratedDispatchTableCore **)
              ((long)iVar2.
                     super__Node_iterator_base<std::pair<XrInstance_T_*const,_std::unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>_>,_false>
                     ._M_cur + 0x10);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return pXVar3;
}

Assistant:

const XrGeneratedDispatchTableCore* RuntimeInterface::GetDispatchTable(XrInstance instance) {
    XrGeneratedDispatchTableCore* table = nullptr;
    std::lock_guard<std::mutex> mlock(GetInstance()->_dispatch_table_mutex);
    auto it = GetInstance()->_dispatch_table_map.find(instance);
    if (it != GetInstance()->_dispatch_table_map.end()) {
        table = it->second.get();
    }
    return table;
}